

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

int32_t safe_sprintf_s(char **buf,size_t *buf_size,char *fmt,...)

{
  char in_AL;
  bool bVar1;
  int iVar2;
  vw_exception *this;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  stringstream __msg;
  string sStack_2a8;
  undefined8 local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  stringstream local_270 [16];
  ostream local_260;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_280 = &stack0x00000008;
  local_288 = 0x3000000018;
  local_278 = local_e8;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar2 = vsnprintf(*buf,*buf_size,fmt,&local_288);
  if (-1 < iVar2) {
    bVar1 = resize_buf_if_needed(buf,buf_size,(ulong)(iVar2 + 1));
    if (bVar1) {
      local_280 = &stack0x00000008;
      local_288 = 0x3000000018;
      local_278 = local_e8;
      vsnprintf(*buf,*buf_size,fmt,&local_288);
    }
    return iVar2;
  }
  std::__cxx11::stringstream::stringstream(local_270);
  std::__ostream_insert<char,std::char_traits<char>>(&local_260,"Encoding error.",0xf);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
             ,0xa9,&sStack_2a8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

int32_t safe_sprintf_s(char*& buf, size_t& buf_size, const char* fmt, ...)
{
  va_list args;
  va_start(args, fmt);
  int32_t len = vsprintf_s(buf, buf_size, fmt, args);
  va_end(args);
  if (len < 0)
    THROW("Encoding error.");
  if (resize_buf_if_needed(buf, buf_size, len + 1))
  {
    va_start(args, fmt);
    vsprintf_s(buf, buf_size, fmt, args);
    va_end(args);
  }

  return len;
}